

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

void __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::direct_remove_child_pointer
          (basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
           *this,uint8_t children_i,db_type *db_instance)

{
  undefined7 in_register_00000031;
  undefined1 local_18 [8];
  leaf_reclaimable_ptr r;
  
  if ((int)CONCAT71(in_register_00000031,children_i) != 0xff) {
    r._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db_instance =
         (_Head_base<1UL,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )(*(ulong *)((long)&this->children + (ulong)children_i * 8) & 0xfffffffffffffff8);
    local_18 = (undefined1  [8])db_instance;
    std::
    unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_18);
    return;
  }
  __assert_fail("children_i != empty_child",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x9d2,
                "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::direct_remove_child_pointer(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

constexpr void direct_remove_child_pointer(std::uint8_t children_i,
                                             db_type &db_instance) noexcept {
    UNODB_DETAIL_ASSERT(children_i != empty_child);

    const auto r{ArtPolicy::reclaim_leaf_on_scope_exit(
        children.pointer_array[children_i].load().template ptr<leaf_type *>(),
        db_instance)};
  }